

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O3

int64_t __thiscall soul::Value::PackedData::getAsInt64(PackedData *this)

{
  Category CVar1;
  Primitive PVar2;
  Type *pTVar3;
  ulong uVar4;
  double dVar5;
  
  pTVar3 = this->type;
  CVar1 = pTVar3->category;
  if (((5 < CVar1) || ((0x32U >> (CVar1 & 0x1f) & 1) == 0)) &&
     ((CVar1 != vector || (pTVar3->boundingSize != 1)))) {
    throwInternalCompilerError
              ("type.isPrimitive() || type.isBoundedInt() || type.isVectorOfSize1()","getAsInt64",
               0xb4);
  }
  PVar2 = (pTVar3->primitiveType).type;
  if (PVar2 == bool_) {
    if (this->size != 1) {
LAB_001bebd0:
      throwInternalCompilerError("size == sizeof (Primitive)","getAs",0x15e);
    }
    uVar4 = (ulong)(*this->data != '\0');
  }
  else if (PVar2 == int64) {
    if (this->size != 8) goto LAB_001bebd0;
    uVar4 = *(ulong *)this->data;
  }
  else if (PVar2 == int32) {
    if (this->size != 4) goto LAB_001bebd0;
    uVar4 = (ulong)*(int *)this->data;
  }
  else {
    if ((PVar2 & ~void_) != float32) {
      throwInternalCompilerError("getAsInt64",0xbb);
    }
    dVar5 = getAsDouble(this);
    uVar4 = (ulong)dVar5;
  }
  return uVar4;
}

Assistant:

int64_t getAsInt64() const
    {
        SOUL_ASSERT (type.isPrimitive() || type.isBoundedInt() || type.isVectorOfSize1());

        if (type.isInteger32())      return getAs<int32_t>();
        if (type.isInteger64())      return getAs<int64_t>();
        if (type.isBool())           return getAs<uint8_t>() != 0 ? 1 : 0;
        if (type.isFloatingPoint())  return static_cast<int64_t> (getAsDouble());

        SOUL_ASSERT_FALSE;
        return {};
    }